

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O0

void buminiz::tdefl_start_static_block(tdefl_compressor *d)

{
  undefined1 *puVar1;
  long in_RDI;
  mz_uint len;
  mz_uint bits;
  mz_uint8 *p;
  mz_uint i;
  int in_stack_00000a20;
  int in_stack_00000a24;
  int in_stack_00000a28;
  int in_stack_00000a2c;
  tdefl_compressor *in_stack_00000a30;
  undefined1 *local_18;
  uint local_c;
  
  local_18 = (undefined1 *)(in_RDI + 0x8f4a);
  for (local_c = 0; local_c < 0x90; local_c = local_c + 1) {
    *local_18 = 8;
    local_18 = local_18 + 1;
  }
  for (; local_c < 0x100; local_c = local_c + 1) {
    *local_18 = 9;
    local_18 = local_18 + 1;
  }
  for (; local_c < 0x118; local_c = local_c + 1) {
    *local_18 = 7;
    local_18 = local_18 + 1;
  }
  for (; local_c < 0x120; local_c = local_c + 1) {
    *local_18 = 8;
    local_18 = local_18 + 1;
  }
  memset((void *)(in_RDI + 0x906a),5,0x20);
  tdefl_optimize_huffman_table
            (in_stack_00000a30,in_stack_00000a2c,in_stack_00000a28,in_stack_00000a24,
             in_stack_00000a20);
  tdefl_optimize_huffman_table
            (in_stack_00000a30,in_stack_00000a2c,in_stack_00000a28,in_stack_00000a24,
             in_stack_00000a20);
  *(uint *)(in_RDI + 0x60) =
       1 << ((byte)*(undefined4 *)(in_RDI + 0x5c) & 0x1f) | *(uint *)(in_RDI + 0x60);
  *(int *)(in_RDI + 0x5c) = *(int *)(in_RDI + 0x5c) + 2;
  while (7 < *(uint *)(in_RDI + 0x5c)) {
    if (*(ulong *)(in_RDI + 0x40) < *(ulong *)(in_RDI + 0x48)) {
      puVar1 = *(undefined1 **)(in_RDI + 0x40);
      *(undefined1 **)(in_RDI + 0x40) = puVar1 + 1;
      *puVar1 = (char)*(undefined4 *)(in_RDI + 0x60);
    }
    *(uint *)(in_RDI + 0x60) = *(uint *)(in_RDI + 0x60) >> 8;
    *(int *)(in_RDI + 0x5c) = *(int *)(in_RDI + 0x5c) + -8;
  }
  return;
}

Assistant:

static void tdefl_start_static_block(tdefl_compressor *d)
{
  mz_uint i;
  mz_uint8 *p = &d->m_huff_code_sizes[0][0];

  for (i = 0; i <= 143; ++i) *p++ = 8;
  for ( ; i <= 255; ++i) *p++ = 9;
  for ( ; i <= 279; ++i) *p++ = 7;
  for ( ; i <= 287; ++i) *p++ = 8;

  memset(d->m_huff_code_sizes[1], 5, 32);

  tdefl_optimize_huffman_table(d, 0, 288, 15, MZ_TRUE);
  tdefl_optimize_huffman_table(d, 1, 32, 15, MZ_TRUE);

  TDEFL_PUT_BITS(1, 2);
}